

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  callback_data cb_data;
  
  if (D < 3) {
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x30])
              (this,data,ix,(ulong)(uint)iy,(ulong)(uint)iw,ih);
    return;
  }
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x31])(this,draw_image_cb);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  if (D<3){ //mono
    draw_image_mono(data, ix, iy, iw, ih, D, LD);
    return;
  }

  struct callback_data cb_data;

  if (!LD) LD = iw*D;

  cb_data.data = data;
  cb_data.D = D;
  cb_data.LD = LD;

  draw_image(draw_image_cb, &cb_data, ix, iy, iw, ih, D);
}